

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O3

void uo_cb_invoke(uo_cb *cb)

{
  uo_linklist *puVar1;
  uo_linklist *puVar2;
  uo_linklist *puVar3;
  long lVar4;
  uo_cb_func_linklist *cb_func_linklist;
  uo_linklist *UNRECOVERED_JUMPTABLE;
  long *in_FS_OFFSET;
  
  puVar2 = (cb->funclist).next;
  if (puVar2 != &cb->funclist) {
    UNRECOVERED_JUMPTABLE = puVar2->next;
    puVar3 = puVar2->prev;
    UNRECOVERED_JUMPTABLE->prev = puVar3;
    puVar3->next = UNRECOVERED_JUMPTABLE;
    puVar2->next = (uo_linklist *)0x0;
    puVar2->prev = (uo_linklist *)0x0;
    UNRECOVERED_JUMPTABLE = puVar2[1].next;
    lVar4 = *in_FS_OFFSET;
    puVar3 = (uo_linklist *)in_FS_OFFSET[-4];
    puVar2->prev = puVar3;
    puVar3->next = puVar2;
    puVar2->next = (uo_linklist *)(lVar4 + -0x28);
    in_FS_OFFSET[-4] = (long)puVar2;
    (*(code *)UNRECOVERED_JUMPTABLE)();
    return;
  }
  free((cb->stack).items);
  puVar2 = &cb->funclist;
  UNRECOVERED_JUMPTABLE = (cb->funclist).next;
  if (UNRECOVERED_JUMPTABLE != puVar2) {
    lVar4 = *in_FS_OFFSET;
    do {
      puVar3 = UNRECOVERED_JUMPTABLE->next;
      puVar1 = UNRECOVERED_JUMPTABLE->prev;
      puVar3->prev = puVar1;
      puVar1->next = puVar3;
      UNRECOVERED_JUMPTABLE->next = (uo_linklist *)0x0;
      UNRECOVERED_JUMPTABLE->prev = (uo_linklist *)0x0;
      puVar3 = (uo_linklist *)in_FS_OFFSET[-4];
      UNRECOVERED_JUMPTABLE->prev = puVar3;
      puVar3->next = UNRECOVERED_JUMPTABLE;
      UNRECOVERED_JUMPTABLE->next = (uo_linklist *)(lVar4 + -0x28);
      in_FS_OFFSET[-4] = (long)UNRECOVERED_JUMPTABLE;
      UNRECOVERED_JUMPTABLE = puVar2->next;
    } while (UNRECOVERED_JUMPTABLE != puVar2);
  }
  if (cb[-1].funclist.next == (uo_linklist *)0x0) {
    lVar4 = *in_FS_OFFSET;
    puVar2 = (uo_linklist *)in_FS_OFFSET[-7];
    cb[-1].funclist.prev = puVar2;
    puVar2->next = &cb[-1].funclist;
    cb[-1].funclist.next = (uo_linklist *)(lVar4 + -0x40);
    in_FS_OFFSET[-7] = (long)&cb[-1].funclist;
    return;
  }
  __assert_fail("!uo__linklist_is_linked(link)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_linklist/src/include/uo_linklist/uo_linklist.h"
                ,0xa6,"void uo__linklist_link(uo_linklist *, uo_linklist *)");
}

Assistant:

void uo_cb_invoke(
    uo_cb *cb)
{
    if (!uo_linklist_is_empty(&cb->funclist))
    {
        uo_cb_func_linklist *cb_func_linklist = (uo_cb_func_linklist *)uo_linklist_next(&cb->funclist);
        uo_linklist_unlink(cb_func_linklist);
        uo_cb_func cb_func = cb_func_linklist->item;
        uo_cb_func_linkpool_return(cb_func_linklist);
        cb_func(cb);
    }
    else
        uo_cb_destroy(cb);
}